

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O0

int __thiscall
QHttpNetworkConnectionPrivate::indexOf(QHttpNetworkConnectionPrivate *this,QIODevice *socket)

{
  long in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  int i;
  char *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar1;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = 0;
  do {
    if (*(int *)(in_RDI + 0xa0) <= iVar1) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),in_RDI,
                 in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
      QMessageLogger::fatal(local_28,"Called with unknown socket object.");
LAB_002ea112:
      __stack_chk_fail();
    }
    if (*(long *)(*(long *)(in_RDI + 0xb8) + (long)iVar1 * 0x108 + 0x10) == in_RSI) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return iVar1;
      }
      goto LAB_002ea112;
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

int QHttpNetworkConnectionPrivate::indexOf(QIODevice *socket) const
{
    for (int i = 0; i < activeChannelCount; ++i)
        if (channels[i].socket == socket)
            return i;

    qFatal("Called with unknown socket object.");
    return 0;
}